

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcold.c
# Opt level: O0

int fffr8r8(double *input,long ntodo,double scale,double zero,int nullcheck,double nullval,
           char *nullarray,int *anynull,double *output,int *status)

{
  short sVar1;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  undefined4 *in_R8;
  void *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  int *in_stack_00000008;
  short iret;
  short *sptr;
  long ii;
  ushort *local_58;
  long local_50;
  
  if (in_EDX == 0) {
    if (((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || ((in_XMM1_Qa != 0.0 || (NAN(in_XMM1_Qa))))) {
      for (local_50 = 0; local_50 < in_RSI; local_50 = local_50 + 1) {
        *(double *)((long)in_R9 + local_50 * 8) =
             *(double *)((long)in_RDI + local_50 * 8) * in_XMM0_Qa + in_XMM1_Qa;
      }
    }
    else {
      memmove(in_R9,in_RDI,in_RSI << 3);
    }
  }
  else {
    local_58 = (ushort *)((long)in_RDI + 6);
    if ((((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))) {
      for (local_50 = 0; local_50 < in_RSI; local_50 = local_50 + 1) {
        if ((*local_58 & 0x7ff0) == 0x7ff0) {
          sVar1 = 1;
        }
        else {
          sVar1 = 0;
          if ((*local_58 & 0x7ff0) == 0) {
            sVar1 = 2;
          }
        }
        if (sVar1 == 0) {
          *(double *)((long)in_R9 + local_50 * 8) =
               *(double *)((long)in_RDI + local_50 * 8) * in_XMM0_Qa + in_XMM1_Qa;
        }
        else if (sVar1 == 1) {
          *in_R8 = 1;
          if (in_EDX == 1) {
            *(undefined8 *)((long)in_R9 + local_50 * 8) = in_XMM2_Qa;
          }
          else {
            *(undefined1 *)(in_RCX + local_50) = 1;
            *(undefined8 *)((long)in_R9 + local_50 * 8) = 0xb8a83e285ebab4b7;
          }
        }
        else {
          *(double *)((long)in_R9 + local_50 * 8) = in_XMM1_Qa;
        }
        local_58 = local_58 + 4;
      }
    }
    else {
      for (local_50 = 0; local_50 < in_RSI; local_50 = local_50 + 1) {
        if ((*local_58 & 0x7ff0) == 0x7ff0) {
          sVar1 = 1;
        }
        else {
          sVar1 = 0;
          if ((*local_58 & 0x7ff0) == 0) {
            sVar1 = 2;
          }
        }
        if (sVar1 == 0) {
          *(undefined8 *)((long)in_R9 + local_50 * 8) = *(undefined8 *)((long)in_RDI + local_50 * 8)
          ;
        }
        else if (sVar1 == 1) {
          *in_R8 = 1;
          if (in_EDX == 1) {
            *(undefined8 *)((long)in_R9 + local_50 * 8) = in_XMM2_Qa;
          }
          else {
            *(undefined1 *)(in_RCX + local_50) = 1;
            *(undefined8 *)((long)in_R9 + local_50 * 8) = 0xb8a83e285ebab4b7;
          }
        }
        else {
          *(undefined8 *)((long)in_R9 + local_50 * 8) = 0;
        }
        local_58 = local_58 + 4;
      }
    }
  }
  return *in_stack_00000008;
}

Assistant:

int fffr8r8(double *input,        /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            double nullval,       /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            double *output,       /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            memmove(output, input, ntodo * sizeof(double) );
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                output[ii] = input[ii] * scale + zero;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr += 3;       /* point to MSBs */
#endif

        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                    {
                        nullarray[ii] = 1;
                       /* explicitly set value in case output contains a NaN */
                        output[ii] = DOUBLENULLVALUE;
                    }
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                  output[ii] = input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                    {
                        nullarray[ii] = 1;
                       /* explicitly set value in case output contains a NaN */
                        output[ii] = DOUBLENULLVALUE;
                    }
                  }
                  else            /* it's an underflow */
                     output[ii] = zero;
              }
              else
                  output[ii] = input[ii] * scale + zero;
            }
        }
    }
    return(*status);
}